

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O2

bool __thiscall
bssl::SSL_HANDSHAKE::GetClientHello
          (SSL_HANDSHAKE *this,SSLMessage *out_msg,SSL_CLIENT_HELLO *out_client_hello)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  CBS CVar4;
  Span<unsigned_char> local_30;
  
  sVar1 = (this->ech_client_hello_buf).size_;
  if (sVar1 == 0) {
    bVar2 = (*this->ssl->method->get_message)(this->ssl,out_msg);
    if (!bVar2) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                    ,0x57);
      return false;
    }
    CVar4 = out_msg->body;
  }
  else {
    out_msg->is_v2_hello = false;
    out_msg->type = '\x01';
    (out_msg->raw).data = (this->ech_client_hello_buf).data_;
    (out_msg->raw).len = sVar1;
    iVar3 = SSL_is_dtls(this->ssl);
    local_30.data_ = (this->ech_client_hello_buf).data_;
    local_30.size_ = (this->ech_client_hello_buf).size_;
    CVar4 = (CBS)Span<unsigned_char>::subspan
                           (&local_30,(ulong)(iVar3 != 0) * 8 + 4,0xffffffffffffffff);
    out_msg->body = CVar4;
  }
  iVar3 = SSL_parse_client_hello(this->ssl,out_client_hello,CVar4.data,CVar4.len);
  if (iVar3 == 0) {
    ssl_send_alert(this->ssl,2,0x32);
  }
  return iVar3 != 0;
}

Assistant:

bool SSL_HANDSHAKE::GetClientHello(SSLMessage *out_msg,
                                   SSL_CLIENT_HELLO *out_client_hello) {
  if (!ech_client_hello_buf.empty()) {
    // If the backing buffer is non-empty, the ClientHelloInner has been set.
    out_msg->is_v2_hello = false;
    out_msg->type = SSL3_MT_CLIENT_HELLO;
    out_msg->raw = CBS(ech_client_hello_buf);
    size_t header_len =
        SSL_is_dtls(ssl) ? DTLS1_HM_HEADER_LENGTH : SSL3_HM_HEADER_LENGTH;
    out_msg->body = CBS(Span(ech_client_hello_buf).subspan(header_len));
  } else if (!ssl->method->get_message(ssl, out_msg)) {
    // The message has already been read, so this cannot fail.
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!SSL_parse_client_hello(ssl, out_client_hello, CBS_data(&out_msg->body),
                              CBS_len(&out_msg->body))) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_DECODE_ERROR);
    return false;
  }
  return true;
}